

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

Json __thiscall slack::_detail::CategoryApi::test_abi_cxx11_(CategoryApi *this)

{
  string *method;
  json_value extraout_RDX;
  undefined8 *in_RSI;
  Json JVar1;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  CategoryApi *this_local;
  Json *json;
  
  local_19 = 0;
  method = (string *)*in_RSI;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"api.test",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Slacking::get((Slacking *)this,method,(string *)local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  JVar1.m_value.object = extraout_RDX.object;
  JVar1._0_8_ = this;
  return JVar1;
}

Assistant:

inline
Json CategoryApi::test() {
    auto json = slack_.get("api.test");
    return json;
}